

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

void Gia_Gen2CodeTest(void)

{
  uint uVar1;
  Vec_Int_t *vCode;
  time_t tVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = 4;
  vCode = Vec_IntAlloc(4);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    uVar1 = rand();
    Vec_IntPush(vCode,uVar1 & 1);
  }
  Gia_Gen2CodePrint(1,2,vCode);
  Vec_IntFree(vCode);
  return;
}

Assistant:

void Gia_Gen2CodeTest()
{
    int i, nLutSize = 1, nLutNum = 2;
    Vec_Int_t * vCode = Vec_IntAlloc( (1 << nLutSize) * nLutNum );
    srand( time(NULL) );
    for ( i = 0; i < (1 << nLutSize) * nLutNum; i++ )
        Vec_IntPush( vCode, rand() & 1 );
    Gia_Gen2CodePrint( nLutSize, nLutNum, vCode );
    Vec_IntFree( vCode );
}